

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O0

void __thiscall CMU462::DynamicScene::Mesh::_bevel_selection(Mesh *this,double inset,double shift)

{
  Vector3D local_58;
  Face *local_40;
  Face *f;
  Edge *e;
  Vertex *v;
  HalfedgeElement *element;
  double shift_local;
  double inset_local;
  Mesh *this_local;
  
  if (((this->super_SceneObject).scene != (Scene *)0x0) &&
     (v = (Vertex *)(((this->super_SceneObject).scene)->selected).element, v != (Vertex *)0x0)) {
    element = (HalfedgeElement *)shift;
    shift_local = inset;
    inset_local = (double)this;
    e = (Edge *)HalfedgeElement::getVertex((HalfedgeElement *)v);
    f = (Face *)HalfedgeElement::getEdge(&v->super_HalfedgeElement);
    local_40 = HalfedgeElement::getFace(&v->super_HalfedgeElement);
    if (e == (Edge *)0x0) {
      if (f == (Face *)0x0) {
        if (local_40 == (Face *)0x0) {
          return;
        }
        HalfedgeMesh::_bevel_fc_reposition_with_dist
                  (&this->mesh,&this->beveledFacePos,&this->bevelVertices,(double)element,
                   shift_local);
      }
      else {
        HalfedgeMesh::_bevel_edge_reposition_with_dist
                  (&this->mesh,&this->beveledEdgePos,&this->bevelVertices,shift_local);
      }
    }
    else {
      Vector3D::Vector3D(&local_58,&this->beveledVertexPos);
      HalfedgeMesh::_bevel_vtx_reposition_with_dist
                (&this->mesh,&local_58,&this->bevelVertices,shift_local);
    }
    Selection::clear(&((this->super_SceneObject).scene)->hovered);
    Selection::clear(&((this->super_SceneObject).scene)->elementTransform->target);
  }
  return;
}

Assistant:

void Mesh::_bevel_selection( double inset, double shift ) {

   if( scene == nullptr ) return;
   HalfedgeElement *element = scene->selected.element;
   if (element == nullptr) return;
   Vertex *v = element->getVertex();
   Edge *e = element->getEdge();
   Face *f = element->getFace();

   if (v != nullptr) {
      mesh._bevel_vtx_reposition_with_dist(beveledVertexPos, bevelVertices, inset);
   } else if (e != nullptr) {
      mesh._bevel_edge_reposition_with_dist(beveledEdgePos, bevelVertices, inset);
   } else if (f != nullptr) {
      mesh._bevel_fc_reposition_with_dist(beveledFacePos, bevelVertices, shift, inset);
   } else {
      return;
   }

   scene->hovered.clear();
   scene->elementTransform->target.clear();
}